

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

int poptag(int f,int n)

{
  char **ppcVar1;
  mgwin *pmVar2;
  tagstack __ptr;
  int iVar3;
  line *plVar4;
  
  __ptr.slh_first = shead.slh_first;
  if (shead.slh_first == (tagpos *)0x0) {
    dobeep();
    iVar3 = 0;
    ewprintf("No previous location for find-tag invocation");
  }
  else {
    ppcVar1 = &(shead.slh_first)->bname;
    shead.slh_first = ((shead.slh_first)->entry).sle_next;
    iVar3 = loadbuffer(*ppcVar1);
    pmVar2 = curwp;
    if (iVar3 == 0) {
      free((__ptr.slh_first)->bname);
      free(__ptr.slh_first);
      iVar3 = 0;
    }
    else {
      iVar3 = (__ptr.slh_first)->dotline;
      curwp->w_dotline = iVar3;
      pmVar2->w_doto = (__ptr.slh_first)->doto;
      plVar4 = (line *)&pmVar2->w_bufp->b_headp;
      iVar3 = iVar3 + 1;
      do {
        plVar4 = plVar4->l_fp;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      (__ptr.slh_first)->dotline = -1;
      pmVar2->w_dotp = plVar4;
      free((__ptr.slh_first)->bname);
      free(__ptr.slh_first);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
poptag(int f, int n)
{
	struct line *dotp;
	struct tagpos *s;

	if (SLIST_EMPTY(&shead)) {
		dobeep();
		ewprintf("No previous location for find-tag invocation");
		return (FALSE);
	}
	s = SLIST_FIRST(&shead);
	SLIST_REMOVE_HEAD(&shead, entry);
	if (loadbuffer(s->bname) == FALSE) {
		free(s->bname);
		free(s);
		return (FALSE);
	}
	curwp->w_dotline = s->dotline;
	curwp->w_doto = s->doto;

	/* storing of dotp in tagpos wouldn't work out in cases when
	 * that buffer is killed by user(dangling pointer). Explicitly
	 * traverse till dotline for correct handling.
	 */
	dotp = curwp->w_bufp->b_headp;
	while (s->dotline--)
		dotp = dotp->l_fp;

	curwp->w_dotp = dotp;
	free(s->bname);
	free(s);
	return (TRUE);
}